

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_slopes.cpp
# Opt level: O2

void P_CopySlopes(void)

{
  int tag;
  double dVar1;
  uint uVar2;
  line_t_conflict *plVar3;
  sector_t_conflict *psVar4;
  sector_t_conflict **ppsVar5;
  sector_t_conflict **ppsVar6;
  long lVar7;
  int s;
  ulong uVar8;
  sector_t_conflict *psVar9;
  int i;
  long lVar10;
  
  lVar7 = 0x2c;
  lVar10 = 0;
  do {
    plVar3 = lines;
    if (numlines <= lVar10) {
      return;
    }
    if (lines[lVar10].special == 0x76) {
      lines[lVar10].special = 0;
      uVar8 = 0;
      while( true ) {
        psVar9 = plVar3[lVar10].backsector;
        if ((ulong)(psVar9 != (sector_t_conflict *)0x0) * 2 + 2 <= uVar8) break;
        tag = *(int *)((long)plVar3->args + uVar8 * 4 + lVar7 + -0x2c);
        if (tag != 0) {
          if ((uVar8 & 2) == 0) {
            psVar9 = plVar3[lVar10].frontsector;
          }
          P_CopyPlane(tag,psVar9,(bool)((byte)uVar8 & 1));
          plVar3 = lines;
        }
        uVar8 = uVar8 + 1;
      }
      if (psVar9 != (sector_t_conflict *)0x0) {
        uVar2 = plVar3[lVar10].args[4] & 3;
        if (uVar2 == 2) {
          psVar4 = plVar3[lVar10].frontsector;
LAB_004504a9:
          (psVar4->floorplane).normal.Z = (psVar9->floorplane).normal.Z;
          dVar1 = (psVar9->floorplane).normal.Y;
          (psVar4->floorplane).normal.X = (psVar9->floorplane).normal.X;
          (psVar4->floorplane).normal.Y = dVar1;
          dVar1 = (psVar9->floorplane).negiC;
          (psVar4->floorplane).D = (psVar9->floorplane).D;
          (psVar4->floorplane).negiC = dVar1;
        }
        else if (uVar2 == 1) {
          psVar4 = psVar9;
          psVar9 = plVar3[lVar10].frontsector;
          goto LAB_004504a9;
        }
        uVar2 = plVar3[lVar10].args[4] & 0xc;
        if (uVar2 == 8) {
          ppsVar6 = &plVar3[lVar10].frontsector;
          ppsVar5 = &plVar3[lVar10].backsector;
        }
        else {
          if (uVar2 != 4) goto LAB_00450531;
          ppsVar5 = &plVar3[lVar10].frontsector;
          ppsVar6 = &plVar3[lVar10].backsector;
        }
        psVar9 = *ppsVar5;
        psVar4 = *ppsVar6;
        (psVar4->ceilingplane).normal.Z = (psVar9->ceilingplane).normal.Z;
        dVar1 = (psVar9->ceilingplane).normal.Y;
        (psVar4->ceilingplane).normal.X = (psVar9->ceilingplane).normal.X;
        (psVar4->ceilingplane).normal.Y = dVar1;
        dVar1 = (psVar9->ceilingplane).negiC;
        (psVar4->ceilingplane).D = (psVar9->ceilingplane).D;
        (psVar4->ceilingplane).negiC = dVar1;
      }
    }
LAB_00450531:
    lVar10 = lVar10 + 1;
    lVar7 = lVar7 + 0x98;
  } while( true );
}

Assistant:

void P_CopySlopes()
{
	for (int i = 0; i < numlines; i++)
	{
		if (lines[i].special == Plane_Copy)
		{
			// The args are used for the tags of sectors to copy:
			// args[0]: front floor
			// args[1]: front ceiling
			// args[2]: back floor
			// args[3]: back ceiling
			// args[4]: copy slopes from one side of the line to the other.
			lines[i].special = 0;
			for (int s = 0; s < (lines[i].backsector ? 4 : 2); s++)
			{
				if (lines[i].args[s])
					P_CopyPlane(lines[i].args[s], 
					(s & 2 ? lines[i].backsector : lines[i].frontsector), s & 1);
			}

			if (lines[i].backsector != NULL)
			{
				if ((lines[i].args[4] & 3) == 1)
				{
					lines[i].backsector->floorplane = lines[i].frontsector->floorplane;
				}
				else if ((lines[i].args[4] & 3) == 2)
				{
					lines[i].frontsector->floorplane = lines[i].backsector->floorplane;
				}
				if ((lines[i].args[4] & 12) == 4)
				{
					lines[i].backsector->ceilingplane = lines[i].frontsector->ceilingplane;
				}
				else if ((lines[i].args[4] & 12) == 8)
				{
					lines[i].frontsector->ceilingplane = lines[i].backsector->ceilingplane;
				}
			}
		}
	}
}